

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestCharReaderFailIfExtraTestcommentAfterBool::TestCharReaderFailIfExtraTestcommentAfterBool
          (TestCharReaderFailIfExtraTestcommentAfterBool *this)

{
  CharReaderFailIfExtraTest::CharReaderFailIfExtraTest(&this->super_CharReaderFailIfExtraTest);
  (this->super_CharReaderFailIfExtraTest).super_TestCase._vptr_TestCase =
       (_func_int **)&PTR__TestCase_00165508;
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderFailIfExtraTest, commentAfterBool) {
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      " true /*trailing\ncomment*/";
  b.settings_["failIfExtra"] = true;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT_STRING_EQUAL("", errs);
  JSONTEST_ASSERT_EQUAL(true, root.asBool());
  delete reader;
}